

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UIDisplayer.cpp
# Opt level: O3

void __thiscall UIDisplayer::drawStartScreen(UIDisplayer *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  PrimitiveDisplayer *this_00;
  Colour *colour;
  string local_38;
  
  glPushMatrix();
  glTranslatef((this->width + -580.0) * 0.5,(this->height + -200.0) * 0.5 + 7.5,0);
  this_00 = this->primitiveDisplayer;
  colour = Palette::getColour(this->palette,0);
  PrimitiveDisplayer::drawRectangleOutline(this_00,20.0,29.0,10.0,colour);
  glPopMatrix();
  paVar1 = &local_38.field_2;
  local_38._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_38,"TETRIS","");
  drawParagraph(this,&local_38,this->height * 0.5 + 35.0,15.0,true);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != paVar1) {
    operator_delete(local_38._M_dataplus._M_p);
  }
  local_38._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_38,"PRESS SPACE TO START","");
  drawParagraph(this,&local_38,this->height * 0.5 + 35.0 + 127.5,4.0,false);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != paVar1) {
    operator_delete(local_38._M_dataplus._M_p);
  }
  return;
}

Assistant:

void UIDisplayer::drawStartScreen(void) {
    GLfloat rectWidth = 29;
    GLfloat rectHeight = 10;

    glPushMatrix();
        glTranslatef((width - rectWidth * 20) / 2, 7.5 + (height - rectHeight * 20)/2, 0);
        primitiveDisplayer->drawRectangleOutline(20, rectWidth, rectHeight, palette->getColour(Palette::GREEN));
    glPopMatrix();
    
    drawParagraph("TETRIS", height/2 + 35, 15, true);
    drawParagraph("PRESS SPACE TO START", linebreak(height/2 + 35, 15), 4);
}